

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkeletonWriter.cpp
# Opt level: O2

void __thiscall
adios2::core::engine::SkeletonWriter::DoPutSync
          (SkeletonWriter *this,Variable<long_double> *variable,longdouble *data)

{
  size_t stepsStart;
  BPInfo *blockInfo;
  
  stepsStart = CurrentStep(this);
  blockInfo = Variable<long_double>::SetBlockInfo(variable,data,stepsStart,1);
  PutSyncCommon<long_double>(this,variable,blockInfo);
  std::
  vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
  ::clear(&variable->m_BlocksInfo);
  return;
}

Assistant:

void SkeletonWriter::Init()
{
    InitParameters();
    InitTransports();
}